

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CoverCrossSymbol::CoverCrossSymbol
          (CoverCrossSymbol *this,Compilation *comp,string_view name,SourceLocation loc,
          span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> targets)

{
  Scope *this_00;
  LanguageVersion LVar1;
  Type *fieldType;
  Type *fieldType_00;
  Type *fieldType_01;
  StructBuilder *in_R9;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  StructBuilder option;
  StructBuilder type_option;
  
  (this->super_Symbol).kind = CoverCross;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  this_00 = &this->super_Scope;
  Scope::Scope(this_00,comp,&this->super_Symbol);
  (this->targets)._M_ptr = targets._M_ptr;
  (this->targets)._M_extent._M_extent_value = targets._M_extent._M_extent_value;
  (this->options)._M_ptr = (pointer)0x0;
  (this->options)._M_extent._M_extent_value = 0;
  (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = false;
  fieldType = comp->bitType;
  fieldType_00 = comp->intType;
  fieldType_01 = comp->stringType;
  LVar1 = (comp->options).languageVersion;
  lookupLocation._12_4_ = 0;
  lookupLocation.scope = (Scope *)0x0;
  lookupLocation.index = 0;
  StructBuilder::StructBuilder(&option,this_00,lookupLocation);
  name_01._M_str = "weight";
  name_01._M_len = 6;
  StructBuilder::addField(&option,name_01,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0);
  name_02._M_str = "goal";
  name_02._M_len = 4;
  StructBuilder::addField(&option,name_02,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0);
  name_03._M_str = "comment";
  name_03._M_len = 7;
  StructBuilder::addField(&option,name_03,fieldType_01,(bitmask<slang::ast::VariableFlags>)0x0);
  name_04._M_str = "at_least";
  name_04._M_len = 8;
  StructBuilder::addField(&option,name_04,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0);
  name_05._M_str = "cross_num_print_missing";
  name_05._M_len = 0x17;
  StructBuilder::addField(&option,name_05,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0);
  if (0 < (int)LVar1) {
    name_06._M_str = "cross_retain_auto_bins";
    name_06._M_len = 0x16;
    StructBuilder::addField(&option,name_06,fieldType,(bitmask<slang::ast::VariableFlags>)0x4);
  }
  addProperty((ast *)this_00,(Scope *)0x6,(string_view)ZEXT816(0x472505),(VariableLifetime)&option,
              in_R9);
  lookupLocation_00._12_4_ = 0;
  lookupLocation_00.scope = (Scope *)0x0;
  lookupLocation_00.index = 0;
  StructBuilder::StructBuilder(&type_option,this_00,lookupLocation_00);
  name_07._M_str = "weight";
  name_07._M_len = 6;
  StructBuilder::addField(&type_option,name_07,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0)
  ;
  name_08._M_str = "goal";
  name_08._M_len = 4;
  StructBuilder::addField(&type_option,name_08,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0)
  ;
  name_09._M_str = "comment";
  name_09._M_len = 7;
  StructBuilder::addField(&type_option,name_09,fieldType_01,(bitmask<slang::ast::VariableFlags>)0x0)
  ;
  name_00._M_str = (char *)0x1;
  name_00._M_len = (size_t)"type_option";
  addProperty((ast *)this_00,(Scope *)0xb,name_00,(VariableLifetime)&type_option,in_R9);
  addBuiltInMethods(this_00,false);
  return;
}

Assistant:

CoverCrossSymbol::CoverCrossSymbol(Compilation& comp, std::string_view name, SourceLocation loc,
                                   std::span<const CoverpointSymbol* const> targets) :
    Symbol(SymbolKind::CoverCross, name, loc), Scope(comp, this), targets(targets) {

    auto& bit_t = comp.getBitType();
    auto& int_t = comp.getIntType();
    auto& string_t = comp.getStringType();
    auto lv = comp.languageVersion();

    StructBuilder option(*this, LookupLocation::min);
    option.addField("weight"sv, int_t);
    option.addField("goal"sv, int_t);
    option.addField("comment"sv, string_t);
    option.addField("at_least"sv, int_t);
    option.addField("cross_num_print_missing"sv, int_t);
    if (lv >= LanguageVersion::v1800_2023)
        option.addField("cross_retain_auto_bins"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    addProperty(*this, "option"sv, VariableLifetime::Automatic, option);

    StructBuilder type_option(*this, LookupLocation::min);
    type_option.addField("weight"sv, int_t);
    type_option.addField("goal"sv, int_t);
    type_option.addField("comment"sv, string_t);
    addProperty(*this, "type_option"sv, VariableLifetime::Static, type_option);

    addBuiltInMethods(*this, false);
}